

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O2

void __thiscall tt::Thread::~Thread(Thread *this)

{
  if ((this->m_started == true) && (this->m_joined == false)) {
    pthread_detach(this->m_pthreadId);
  }
  CountDownLatch::~CountDownLatch(&this->m_latch);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::_Function_base::~_Function_base(&(this->m_func).super__Function_base);
  return;
}

Assistant:

Thread::~Thread(){
	if(m_started && !m_joined) pthread_detach(m_pthreadId);
}